

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_STRING::Convert(_Type_STRING *this,Variable *obj,Type *type)

{
  bool bVar1;
  String *string;
  String *this_00;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Type *type_local;
  Variable *obj_local;
  _Type_STRING *this_local;
  Variable *res;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    pOVar2 = Variable::operator->((Variable *)type);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)type);
    string = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)this);
    this_00 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator=(this_00,string);
    puVar3 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->((Variable *)type);
    VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = obj->GetData<String>();
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}